

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O3

void mbedtls_md_free(mbedtls_md_context_t *ctx)

{
  int iVar1;
  long lVar2;
  void *__ptr;
  
  if ((ctx != (mbedtls_md_context_t *)0x0) && (ctx->md_info != (mbedtls_md_info_t *)0x0)) {
    if (ctx->md_ctx != (void *)0x0) {
      (*ctx->md_info->ctx_free_func)(ctx->md_ctx);
    }
    __ptr = ctx->hmac_ctx;
    if (__ptr != (void *)0x0) {
      iVar1 = ctx->md_info->block_size;
      if (iVar1 != 0) {
        lVar2 = 0;
        do {
          *(undefined1 *)((long)__ptr + lVar2) = 0;
          lVar2 = lVar2 + 1;
        } while (iVar1 * 2 != lVar2);
        __ptr = ctx->hmac_ctx;
      }
      free(__ptr);
    }
    lVar2 = 0;
    do {
      *(undefined1 *)((long)&ctx->md_info + lVar2) = 0;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x18);
  }
  return;
}

Assistant:

void mbedtls_md_free( mbedtls_md_context_t *ctx )
{
    if( ctx == NULL || ctx->md_info == NULL )
        return;

    if( ctx->md_ctx != NULL )
        ctx->md_info->ctx_free_func( ctx->md_ctx );

    if( ctx->hmac_ctx != NULL )
    {
        mbedtls_zeroize( ctx->hmac_ctx, 2 * ctx->md_info->block_size );
        mbedtls_free( ctx->hmac_ctx );
    }

    mbedtls_zeroize( ctx, sizeof( mbedtls_md_context_t ) );
}